

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateBuildDescriptors
          (FileGenerator *this,Printer *printer)

{
  string **ppsVar1;
  undefined8 *puVar2;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar3;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *psVar4;
  scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator> *psVar5;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *psVar6;
  FileDescriptor *pFVar7;
  char *__function;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  unsigned_long extraout_RDX_02;
  unsigned_long extraout_RDX_03;
  unsigned_long i;
  ulong uVar8;
  long lVar9;
  long lVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependency_package_parts;
  string local_170;
  FileDescriptorProto file_proto;
  string local_70;
  string local_50;
  
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) {
    GlobalAssignDescriptorsName((string *)&file_proto,*(string **)this->file_);
    io::Printer::Print(printer,"\nvoid $assigndescriptorsname$() {\n","assigndescriptorsname",
                       (string *)&file_proto);
    ppsVar1 = &file_proto.name_;
    if (file_proto.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)ppsVar1) {
      operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                      (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
    }
    io::Printer::Indent(printer);
    GlobalAddDescriptorsName((string *)&file_proto,*(string **)this->file_);
    io::Printer::Print(printer,"$adddescriptorsname$();\n","adddescriptorsname",
                       (string *)&file_proto);
    if (file_proto.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)ppsVar1) {
      operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                      (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
    }
    io::Printer::Print(printer,
                       "const ::google::protobuf::FileDescriptor* file =\n  ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(\n    \"$filename$\");\nGOOGLE_CHECK(file != NULL);\n"
                       ,"filename",*(string **)this->file_);
    if (0 < *(int *)(this->file_ + 0x48)) {
      lVar9 = 0;
      do {
        psVar3 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
                 ::operator[](&this->message_generators_,lVar9);
        if (psVar3->ptr_ == (MessageGenerator *)0x0) goto LAB_001bbc50;
        MessageGenerator::GenerateDescriptorInitializer(psVar3->ptr_,printer,(int)lVar9);
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)(this->file_ + 0x48));
    }
    pFVar7 = this->file_;
    if (0 < *(int *)(pFVar7 + 0x58)) {
      lVar9 = 0;
      do {
        psVar4 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
                 ::operator[](&this->enum_generators_,lVar9);
        if (psVar4->ptr_ == (EnumGenerator *)0x0) {
          __function = 
          "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cxx::EnumGenerator]"
          ;
          goto LAB_001bbc65;
        }
        EnumGenerator::GenerateDescriptorInitializer(psVar4->ptr_,printer,(int)lVar9);
        lVar9 = lVar9 + 1;
        pFVar7 = this->file_;
      } while (lVar9 < *(int *)(pFVar7 + 0x58));
    }
    if ((((0 < *(int *)(pFVar7 + 0x68)) && (*(int *)(*(long *)(pFVar7 + 0x88) + 0x50) != 3)) &&
        (*(char *)(*(long *)(pFVar7 + 0x88) + 0x56) == '\x01')) &&
       (0 < *(int *)(this->file_ + 0x68))) {
      lVar9 = 0;
      do {
        psVar5 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>_>
                 ::operator[](&this->service_generators_,lVar9);
        if (psVar5->ptr_ == (ServiceGenerator *)0x0) {
          __function = 
          "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>::operator->() const [C = google::protobuf::compiler::cxx::ServiceGenerator]"
          ;
          goto LAB_001bbc65;
        }
        ServiceGenerator::GenerateDescriptorInitializer(psVar5->ptr_,printer,(int)lVar9);
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)(this->file_ + 0x68));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    GlobalAssignDescriptorsName((string *)&file_proto,*(string **)this->file_);
    io::Printer::Print(printer,
                       "namespace {\n\nGOOGLE_PROTOBUF_DECLARE_ONCE(protobuf_AssignDescriptors_once_);\ninline void protobuf_AssignDescriptorsOnce() {\n  ::google::protobuf::GoogleOnceInit(&protobuf_AssignDescriptors_once_,\n                 &$assigndescriptorsname$);\n}\n\n"
                       ,"assigndescriptorsname",(string *)&file_proto);
    if (file_proto.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)ppsVar1) {
      operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                      (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
    }
    io::Printer::Print(printer,
                       "void protobuf_RegisterTypes(const ::std::string&) {\n  protobuf_AssignDescriptorsOnce();\n"
                      );
    io::Printer::Indent(printer);
    if (0 < *(int *)(this->file_ + 0x48)) {
      lVar9 = 0;
      do {
        psVar3 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
                 ::operator[](&this->message_generators_,lVar9);
        if (psVar3->ptr_ == (MessageGenerator *)0x0) goto LAB_001bbc50;
        MessageGenerator::GenerateTypeRegistrations(psVar3->ptr_,printer);
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)(this->file_ + 0x48));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n}  // namespace\n");
  }
  GlobalShutdownFileName((string *)&file_proto,*(string **)this->file_);
  io::Printer::Print(printer,"\nvoid $shutdownfilename$() {\n","shutdownfilename",
                     (string *)&file_proto);
  if (file_proto.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&file_proto.name_
     ) {
    operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                    (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
  }
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->file_ + 0x48)) {
    lVar9 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar9);
      if (psVar3->ptr_ == (MessageGenerator *)0x0) goto LAB_001bbc50;
      MessageGenerator::GenerateShutdownCode(psVar3->ptr_,printer);
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(this->file_ + 0x48));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  pFVar7 = this->file_;
  GlobalAddDescriptorsName((string *)&file_proto,*(string **)pFVar7);
  dependency_package_parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&dependency_package_parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dependency_package_parts,"");
  PrintHandlingOptionalStaticInitializers
            (pFVar7,printer,
             "void $adddescriptorsname$() {\n  static bool already_here = false;\n  if (already_here) return;\n  already_here = true;\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n"
             ,"void $adddescriptorsname$_impl() {\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n",
             "adddescriptorsname",(string *)&file_proto,(char *)0x0,
             (string *)&dependency_package_parts);
  if (dependency_package_parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&dependency_package_parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(dependency_package_parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((dependency_package_parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (file_proto.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&file_proto.name_
     ) {
    operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                    (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
  }
  io::Printer::Indent(printer);
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x18)) {
    lVar9 = 0;
    do {
      puVar2 = *(undefined8 **)(*(long *)(pFVar7 + 0x20) + lVar9 * 8);
      dependency_package_parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dependency_package_parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dependency_package_parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SplitStringUsing((string *)puVar2[1],".",&dependency_package_parts);
      io::Printer::Print(printer,"::");
      if (dependency_package_parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          dependency_package_parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar10 = 0;
        uVar8 = 0;
        do {
          io::Printer::Print(printer,"$name$::","name",
                             (string *)
                             ((long)&((dependency_package_parts.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar10));
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar8 < (ulong)((long)dependency_package_parts.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)dependency_package_parts.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      GlobalAddDescriptorsName((string *)&file_proto,(string *)*puVar2);
      io::Printer::Print(printer,"$name$();\n","name",(string *)&file_proto);
      if (file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
          (MessageLite)&file_proto.name_) {
        operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                        (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dependency_package_parts);
      lVar9 = lVar9 + 1;
      pFVar7 = this->file_;
    } while (lVar9 < *(int *)(pFVar7 + 0x18));
  }
  if (*(int *)(*(long *)(pFVar7 + 0x88) + 0x50) != 3) {
    FileDescriptorProto::FileDescriptorProto(&file_proto);
    FileDescriptor::CopyTo(this->file_,&file_proto);
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&dependency_package_parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)dependency_package_parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    MessageLite::SerializeToString((MessageLite *)&file_proto,(string *)&dependency_package_parts);
    io::Printer::Print(printer,"::google::protobuf::DescriptorPool::InternalAddGeneratedFile(");
    i = extraout_RDX;
    if (dependency_package_parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      uVar8 = 0;
      do {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&dependency_package_parts);
        CEscape(&local_50,&local_70);
        EscapeTrigraphs(&local_170,&local_50);
        io::Printer::Print(printer,"\n  \"$data$\"","data",&local_170);
        i = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          i = extraout_RDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          i = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          i = extraout_RDX_03;
        }
        uVar8 = uVar8 + 0x28;
      } while (uVar8 < dependency_package_parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    }
    SimpleItoa_abi_cxx11_
              (&local_170,
               (protobuf *)
               dependency_package_parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,i);
    io::Printer::Print(printer,", $size$);\n","size",&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Print(printer,
                       "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n  \"$filename$\", &protobuf_RegisterTypes);\n"
                       ,"filename",*(string **)this->file_);
    if (dependency_package_parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&dependency_package_parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(dependency_package_parts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((dependency_package_parts.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    FileDescriptorProto::~FileDescriptorProto(&file_proto);
  }
  if (0 < *(int *)(this->file_ + 0x48)) {
    lVar9 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar9);
      if (psVar3->ptr_ == (MessageGenerator *)0x0) goto LAB_001bbc50;
      MessageGenerator::GenerateDefaultInstanceAllocator(psVar3->ptr_,printer);
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(this->file_ + 0x48));
  }
  if (0 < *(int *)(this->file_ + 0x78)) {
    lVar9 = 0;
    do {
      psVar6 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar9);
      if (psVar6->ptr_ == (ExtensionGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::cxx::ExtensionGenerator]"
        ;
        goto LAB_001bbc65;
      }
      ExtensionGenerator::GenerateRegistration(psVar6->ptr_,printer);
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(this->file_ + 0x78));
  }
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x48)) {
    lVar9 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar9);
      if (psVar3->ptr_ == (MessageGenerator *)0x0) {
LAB_001bbc50:
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cxx::MessageGenerator]"
        ;
LAB_001bbc65:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,__function);
      }
      MessageGenerator::GenerateDefaultInstanceInitializer(psVar3->ptr_,printer);
      lVar9 = lVar9 + 1;
      pFVar7 = this->file_;
    } while (lVar9 < *(int *)(pFVar7 + 0x48));
  }
  GlobalShutdownFileName((string *)&file_proto,*(string **)pFVar7);
  io::Printer::Print(printer,"::google::protobuf::internal::OnShutdown(&$shutdownfilename$);\n",
                     "shutdownfilename",(string *)&file_proto);
  if (file_proto.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&file_proto.name_
     ) {
    operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                    (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  pFVar7 = this->file_;
  GlobalAddDescriptorsName((string *)&file_proto,*(string **)pFVar7);
  FilenameIdentifier((string *)&dependency_package_parts,*(string **)this->file_);
  PrintHandlingOptionalStaticInitializers
            (pFVar7,printer,
             "// Force AddDescriptors() to be called at static initialization time.\nstruct StaticDescriptorInitializer_$filename$ {\n  StaticDescriptorInitializer_$filename$() {\n    $adddescriptorsname$();\n  }\n} static_descriptor_initializer_$filename$_;\n"
             ,
             "GOOGLE_PROTOBUF_DECLARE_ONCE($adddescriptorsname$_once_);\nvoid $adddescriptorsname$() {\n  ::google::protobuf::::google::protobuf::GoogleOnceInit(&$adddescriptorsname$_once_,\n                 &$adddescriptorsname$_impl);\n}\n"
             ,"adddescriptorsname",(string *)&file_proto,"filename",
             (string *)&dependency_package_parts);
  if (dependency_package_parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&dependency_package_parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(dependency_package_parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((dependency_package_parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (file_proto.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&file_proto.name_
     ) {
    operator_delete((void *)file_proto.super_Message.super_MessageLite._vptr_MessageLite,
                    (ulong)((long)&((file_proto.name_)->_M_dataplus)._M_p + 1));
  }
  return;
}

Assistant:

void FileGenerator::GenerateBuildDescriptors(io::Printer* printer) {
  // AddDescriptors() is a file-level procedure which adds the encoded
  // FileDescriptorProto for this .proto file to the global DescriptorPool for
  // generated files (DescriptorPool::generated_pool()). It either runs at
  // static initialization time (by default) or when default_instance() is
  // called for the first time (in LITE_RUNTIME mode with
  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER flag enabled). This procedure also
  // constructs default instances and registers extensions.
  //
  // Its sibling, AssignDescriptors(), actually pulls the compiled
  // FileDescriptor from the DescriptorPool and uses it to populate all of
  // the global variables which store pointers to the descriptor objects.
  // It also constructs the reflection objects.  It is called the first time
  // anyone calls descriptor() or GetReflection() on one of the types defined
  // in the file.

  // In optimize_for = LITE_RUNTIME mode, we don't generate AssignDescriptors()
  // and we only use AddDescriptors() to allocate default instances.
  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "\n"
      "void $assigndescriptorsname$() {\n",
      "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()));
    printer->Indent();

    // Make sure the file has found its way into the pool.  If a descriptor
    // is requested *during* static init then AddDescriptors() may not have
    // been called yet, so we call it manually.  Note that it's fine if
    // AddDescriptors() is called multiple times.
    printer->Print(
      "$adddescriptorsname$();\n",
      "adddescriptorsname", GlobalAddDescriptorsName(file_->name()));

    // Get the file's descriptor from the pool.
    printer->Print(
      "const ::google::protobuf::FileDescriptor* file =\n"
      "  ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(\n"
      "    \"$filename$\");\n"
      // Note that this GOOGLE_CHECK is necessary to prevent a warning about "file"
      // being unused when compiling an empty .proto file.
      "GOOGLE_CHECK(file != NULL);\n",
      "filename", file_->name());

    // Go through all the stuff defined in this file and generated code to
    // assign the global descriptor pointers based on the file descriptor.
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateDescriptorInitializer(printer, i);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      enum_generators_[i]->GenerateDescriptorInitializer(printer, i);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        service_generators_[i]->GenerateDescriptorInitializer(printer, i);
      }
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n");

    // ---------------------------------------------------------------

    // protobuf_AssignDescriptorsOnce():  The first time it is called, calls
    // AssignDescriptors().  All later times, waits for the first call to
    // complete and then returns.
    printer->Print(
      "namespace {\n"
      "\n"
      "GOOGLE_PROTOBUF_DECLARE_ONCE(protobuf_AssignDescriptors_once_);\n"
      "inline void protobuf_AssignDescriptorsOnce() {\n"
      "  ::google::protobuf::GoogleOnceInit(&protobuf_AssignDescriptors_once_,\n"
      "                 &$assigndescriptorsname$);\n"
      "}\n"
      "\n",
      "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()));

    // protobuf_RegisterTypes():  Calls
    // MessageFactory::InternalRegisterGeneratedType() for each message type.
    printer->Print(
      "void protobuf_RegisterTypes(const ::std::string&) {\n"
      "  protobuf_AssignDescriptorsOnce();\n");
    printer->Indent();

    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateTypeRegistrations(printer);
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n"
      "}  // namespace\n");
  }

  // -----------------------------------------------------------------

  // ShutdownFile():  Deletes descriptors, default instances, etc. on shutdown.
  printer->Print(
    "\n"
    "void $shutdownfilename$() {\n",
    "shutdownfilename", GlobalShutdownFileName(file_->name()));
  printer->Indent();

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateShutdownCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n\n");

  // -----------------------------------------------------------------

  // Now generate the AddDescriptors() function.
  PrintHandlingOptionalStaticInitializers(
    file_, printer,
    // With static initializers.
    // Note that we don't need any special synchronization in the following code
    // because it is called at static init time before any threads exist.
    "void $adddescriptorsname$() {\n"
    "  static bool already_here = false;\n"
    "  if (already_here) return;\n"
    "  already_here = true;\n"
    "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n"
    "\n",
    // Without.
    "void $adddescriptorsname$_impl() {\n"
    "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n"
    "\n",
    // Vars.
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()));

  printer->Indent();

  // Call the AddDescriptors() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    vector<string> dependency_package_parts;
    SplitStringUsing(dependency->package(), ".", &dependency_package_parts);
    printer->Print("::");
    for (int j = 0; j < dependency_package_parts.size(); j++) {
      printer->Print("$name$::",
                     "name", dependency_package_parts[j]);
    }
    // Call its AddDescriptors function.
    printer->Print(
      "$name$();\n",
      "name", GlobalAddDescriptorsName(dependency->name()));
  }

  if (HasDescriptorMethods(file_)) {
    // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
    // and embed it as a string literal, which is parsed and built into real
    // descriptors at initialization time.
    FileDescriptorProto file_proto;
    file_->CopyTo(&file_proto);
    string file_data;
    file_proto.SerializeToString(&file_data);

    printer->Print(
      "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(");

    // Only write 40 bytes per line.
    static const int kBytesPerLine = 40;
    for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
      printer->Print("\n  \"$data$\"",
                     "data",
                     EscapeTrigraphs(
                         CEscape(file_data.substr(i, kBytesPerLine))));
    }
    printer->Print(
        ", $size$);\n",
      "size", SimpleItoa(file_data.size()));

    // Call MessageFactory::InternalRegisterGeneratedFile().
    printer->Print(
      "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n"
      "  \"$filename$\", &protobuf_RegisterTypes);\n",
      "filename", file_->name());
  }

  // Allocate and initialize default instances.  This can't be done lazily
  // since default instances are returned by simple accessors and are used with
  // extensions.  Speaking of which, we also register extensions at this time.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateDefaultInstanceAllocator(printer);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }

  printer->Print(
    "::google::protobuf::internal::OnShutdown(&$shutdownfilename$);\n",
    "shutdownfilename", GlobalShutdownFileName(file_->name()));

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  PrintHandlingOptionalStaticInitializers(
    file_, printer,
    // With static initializers.
    "// Force AddDescriptors() to be called at static initialization time.\n"
    "struct StaticDescriptorInitializer_$filename$ {\n"
    "  StaticDescriptorInitializer_$filename$() {\n"
    "    $adddescriptorsname$();\n"
    "  }\n"
    "} static_descriptor_initializer_$filename$_;\n",
    // Without.
    "GOOGLE_PROTOBUF_DECLARE_ONCE($adddescriptorsname$_once_);\n"
    "void $adddescriptorsname$() {\n"
    "  ::google::protobuf::::google::protobuf::GoogleOnceInit(&$adddescriptorsname$_once_,\n"
    "                 &$adddescriptorsname$_impl);\n"
    "}\n",
    // Vars.
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()),
    "filename", FilenameIdentifier(file_->name()));
}